

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

void sink(char *targ,char *src)

{
  bool bVar1;
  StripCtrlChars *sccpub;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  WFile *f_00;
  time_t start;
  time_t tVar7;
  char *local_8100;
  char *san_4;
  int iStack_80f0;
  int read;
  uint64_t blksize;
  char transbuf [32768];
  char *local_e0;
  char *san_3;
  char *san_2;
  char *san_1;
  char *san;
  char *santarg;
  char *sanname;
  char *stripsrc;
  char *striptarget;
  scp_sink_action act;
  char *stat_name;
  time_t stat_lasttime;
  time_t stat_starttime;
  uint64_t stat_bytes;
  ulong uStack_38;
  _Bool wrerror;
  uint64_t received;
  WFile *f;
  int attr;
  _Bool exists;
  _Bool targisdir;
  char *destfname;
  char *src_local;
  char *targ_local;
  
  bVar1 = false;
  iVar3 = file_type(targ);
  if (((targetshouldbedirectory & 1U) != 0) && (iVar3 != 2)) {
    bump("%s: Not a directory",targ);
  }
  scp_sink_init();
  act._0_8_ = strbuf_new();
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          iVar4 = scp_get_sink_action((scp_sink_action *)&striptarget);
          if ((iVar4 != 0) || ((int)striptarget == 3)) goto LAB_00113d98;
        } while ((int)striptarget == 4);
        if (iVar3 != 2) {
          _attr = dupstr(targ);
        }
        else {
          stripsrc = stripslashes((char *)act.buf,true);
          if ((strbuf *)stripsrc != act.buf) {
            santarg = stripctrl_string(string_scc,(char *)act.buf);
            while (santarg != (char *)0x0) {
              san = stripctrl_string(string_scc,stripsrc);
              while (san != (char *)0x0) {
                tell_user(_stderr,"warning: remote host sent a compound pathname \'%s\'",santarg);
                tell_user(_stderr,"         renaming local file to \'%s\'",san);
                safefree(san);
                san = (char *)0x0;
              }
              safefree(santarg);
              santarg = (char *)0x0;
            }
          }
          _Var2 = is_dots(stripsrc);
          if (_Var2) {
            bump("security violation: remote host attempted to write to a \'.\' or \'..\' path!");
          }
          if (src != (char *)0x0) {
            pcVar6 = stripslashes(src,true);
            iVar4 = strcmp(stripsrc,pcVar6);
            if (((iVar4 != 0) && ((using_sftp & 1U) == 0)) && ((scp_unsafe_mode & 1U) == 0)) {
              san_1 = stripctrl_string(string_scc,stripsrc);
              while (san_1 != (char *)0x0) {
                tell_user(_stderr,"warning: remote host tried to write to a file called \'%s\'",
                          san_1);
                safefree(san_1);
                san_1 = (char *)0x0;
              }
              tell_user(_stderr,"         when we requested a file called \'%s\'.",pcVar6);
              tell_user(_stderr,
                        "         If this is a wildcard, consider upgrading to SSH-2 or using");
              tell_user(_stderr,
                        "         the \'-unsafe\' option. Renaming of this file has been disallowed."
                       );
              stripsrc = pcVar6;
            }
          }
          if (*targ == '\0') {
            _attr = dupstr(stripsrc);
          }
          else {
            _attr = dir_file_cat(targ,stripsrc);
          }
        }
        iVar4 = file_type(_attr);
        if ((int)striptarget != 2) break;
        if ((iVar4 == 0) || (iVar4 == 2)) {
          if ((iVar4 != 0) || (_Var2 = create_directory(_attr), _Var2)) {
            sink(_attr,(char *)0x0);
            safefree(_attr);
          }
          else {
            san_3 = stripctrl_string(string_scc,_attr);
            while (san_3 != (char *)0x0) {
              run_err("%s: Cannot create directory",san_3);
              safefree(san_3);
              san_3 = (char *)0x0;
            }
            safefree(_attr);
          }
        }
        else {
          san_2 = stripctrl_string(string_scc,_attr);
          while (san_2 != (char *)0x0) {
            run_err("%s: Not a directory",san_2);
            safefree(san_2);
            san_2 = (char *)0x0;
          }
          safefree(_attr);
        }
      }
      f_00 = open_new_file(_attr,(long)act.name);
      if (f_00 != (WFile *)0x0) break;
      local_e0 = stripctrl_string(string_scc,_attr);
      while (local_e0 != (char *)0x0) {
        run_err("%s: Cannot create file",local_e0);
        safefree(local_e0);
        local_e0 = (char *)0x0;
      }
      safefree(_attr);
    }
    iVar4 = scp_accept_filexfer();
    if (iVar4 != 0) break;
    stat_starttime = 0;
    start = time((time_t *)0x0);
    sccpub = string_scc;
    stat_name = (char *)0x0;
    pcVar6 = stripslashes(_attr,true);
    act.mtime = (unsigned_long)stripctrl_string(sccpub,pcVar6);
    uStack_38 = 0;
    while (uStack_38 < (ulong)act.permissions) {
      iStack_80f0 = 0x8000;
      if (act.permissions - uStack_38 < 0x8000) {
        iStack_80f0 = (int)act.permissions - (int)uStack_38;
      }
      iVar4 = scp_recv_filedata((char *)&blksize,iStack_80f0);
      if (iVar4 < 1) {
        bump("Lost connection");
      }
      if (bVar1) {
        uStack_38 = (long)iVar4 + uStack_38;
      }
      else {
        iVar5 = write_to_file(f_00,&blksize,iVar4);
        if (iVar5 == iVar4) {
          if ((statistics & 1U) != 0) {
            stat_starttime = iVar4 + stat_starttime;
            tVar7 = time((time_t *)0x0);
            if (((long)stat_name < tVar7) || (uStack_38 + (long)iVar4 == act.permissions)) {
              stat_name = (char *)time((time_t *)0x0);
              print_stats((char *)act.mtime,act.permissions,stat_starttime,start,(time_t)stat_name);
            }
          }
          uStack_38 = (long)iVar4 + uStack_38;
        }
        else {
          bVar1 = true;
          if ((statistics & 1U) != 0) {
            printf("\r%-25.25s | %50s\n",act.mtime,"Write error.. waiting for end of file");
          }
          uStack_38 = (long)iVar4 + uStack_38;
        }
      }
    }
    if (((byte)act.size & 1) != 0) {
      set_file_times(f_00,act.atime,act._40_8_);
    }
    close_wfile(f_00);
    if (bVar1) {
      local_8100 = stripctrl_string(string_scc,_attr);
      while (local_8100 != (char *)0x0) {
        run_err("%s: Write error",local_8100);
        safefree(local_8100);
        local_8100 = (char *)0x0;
      }
      safefree(_attr);
    }
    else {
      scp_finish_filerecv();
      safefree((void *)act.mtime);
      safefree(_attr);
    }
  }
  safefree(_attr);
  close_wfile(f_00);
LAB_00113d98:
  strbuf_free((strbuf *)act._0_8_);
  return;
}

Assistant:

static void sink(const char *targ, const char *src)
{
    char *destfname;
    bool targisdir = false;
    bool exists;
    int attr;
    WFile *f;
    uint64_t received;
    bool wrerror = false;
    uint64_t stat_bytes;
    time_t stat_starttime, stat_lasttime;
    char *stat_name;

    attr = file_type(targ);
    if (attr == FILE_TYPE_DIRECTORY)
        targisdir = true;

    if (targetshouldbedirectory && !targisdir)
        bump("%s: Not a directory", targ);

    scp_sink_init();

    struct scp_sink_action act;
    act.buf = strbuf_new();

    while (1) {

        if (scp_get_sink_action(&act))
            goto out;

        if (act.action == SCP_SINK_ENDDIR)
            goto out;

        if (act.action == SCP_SINK_RETRY)
            continue;

        if (targisdir) {
            /*
             * Prevent the remote side from maliciously writing to
             * files outside the target area by sending a filename
             * containing `../'. In fact, it shouldn't be sending
             * filenames with any slashes or colons in at all; so
             * we'll find the last slash, backslash or colon in the
             * filename and use only the part after that. (And
             * warn!)
             *
             * In addition, we also ensure here that if we're
             * copying a single file and the target is a directory
             * (common usage: `pscp host:filename .') the remote
             * can't send us a _different_ file name. We can
             * distinguish this case because `src' will be non-NULL
             * and the last component of that will fail to match
             * (the last component of) the name sent.
             *
             * Well, not always; if `src' is a wildcard, we do
             * expect to get back filenames that don't correspond
             * exactly to it. Ideally in this case, we would like
             * to ensure that the returned filename actually
             * matches the wildcard pattern - but one of SCP's
             * protocol infelicities is that wildcard matching is
             * done at the server end _by the server's rules_ and
             * so in general this is infeasible. Hence, we only
             * accept filenames that don't correspond to `src' if
             * unsafe mode is enabled or we are using SFTP (which
             * resolves remote wildcards on the client side and can
             * be trusted).
             */
            char *striptarget, *stripsrc;

            striptarget = stripslashes(act.name, true);
            if (striptarget != act.name) {
                with_stripctrl(sanname, act.name) {
                    with_stripctrl(santarg, striptarget) {
                        tell_user(stderr, "warning: remote host sent a"
                                  " compound pathname '%s'", sanname);
                        tell_user(stderr, "         renaming local"
                                  " file to '%s'", santarg);
                    }
                }
            }

            /*
             * Also check to see if the target filename is '.' or
             * '..', or indeed '...' and so on because Windows
             * appears to interpret those like '..'.
             */
            if (is_dots(striptarget)) {
                bump("security violation: remote host attempted to write to"
                     " a '.' or '..' path!");
            }

            if (src) {
                stripsrc = stripslashes(src, true);
                if (strcmp(striptarget, stripsrc) &&
                    !using_sftp && !scp_unsafe_mode) {
                    with_stripctrl(san, striptarget)
                        tell_user(stderr, "warning: remote host tried to "
                                  "write to a file called '%s'", san);
                    tell_user(stderr, "         when we requested a file "
                              "called '%s'.", stripsrc);
                    tell_user(stderr, "         If this is a wildcard, "
                              "consider upgrading to SSH-2 or using");
                    tell_user(stderr, "         the '-unsafe' option. Renaming"
                              " of this file has been disallowed.");
                    /* Override the name the server provided with our own. */
                    striptarget = stripsrc;
                }
            }

            if (targ[0] != '\0')
                destfname = dir_file_cat(targ, striptarget);
            else
                destfname = dupstr(striptarget);
        } else {
            /*
             * In this branch of the if, the target area is a
             * single file with an explicitly specified name in any
             * case, so there's no danger.
             */
            destfname = dupstr(targ);
        }
        attr = file_type(destfname);
        exists = (attr != FILE_TYPE_NONEXISTENT);

        if (act.action == SCP_SINK_DIR) {
            if (exists && attr != FILE_TYPE_DIRECTORY) {
                with_stripctrl(san, destfname)
                    run_err("%s: Not a directory", san);
                sfree(destfname);
                continue;
            }
            if (!exists) {
                if (!create_directory(destfname)) {
                    with_stripctrl(san, destfname)
                        run_err("%s: Cannot create directory", san);
                    sfree(destfname);
                    continue;
                }
            }
            sink(destfname, NULL);
            /* can we set the timestamp for directories ? */
            sfree(destfname);
            continue;
        }

        f = open_new_file(destfname, act.permissions);
        if (f == NULL) {
            with_stripctrl(san, destfname)
                run_err("%s: Cannot create file", san);
            sfree(destfname);
            continue;
        }

        if (scp_accept_filexfer()) {
            sfree(destfname);
            close_wfile(f);
            goto out;
        }

        stat_bytes = 0;
        stat_starttime = time(NULL);
        stat_lasttime = 0;
        stat_name = stripctrl_string(
            string_scc, stripslashes(destfname, true));

        received = 0;
        while (received < act.size) {
            char transbuf[32768];
            uint64_t blksize;
            int read;
            blksize = 32768;
            if (blksize > act.size - received)
                blksize = act.size - received;
            read = scp_recv_filedata(transbuf, (int)blksize);
            if (read <= 0)
                bump("Lost connection");
            if (wrerror) {
                received += read;
                continue;
            }
            if (write_to_file(f, transbuf, read) != (int)read) {
                wrerror = true;
                /* FIXME: in sftp we can actually abort the transfer */
                if (statistics)
                    printf("\r%-25.25s | %50s\n",
                           stat_name,
                           "Write error.. waiting for end of file");
                received += read;
                continue;
            }
            if (statistics) {
                stat_bytes += read;
                if (time(NULL) > stat_lasttime ||
                    received + read == act.size) {
                    stat_lasttime = time(NULL);
                    print_stats(stat_name, act.size, stat_bytes,
                                stat_starttime, stat_lasttime);
                }
            }
            received += read;
        }
        if (act.settime) {
            set_file_times(f, act.mtime, act.atime);
        }

        close_wfile(f);
        if (wrerror) {
            with_stripctrl(san, destfname)
                run_err("%s: Write error", san);
            sfree(destfname);
            continue;
        }
        (void) scp_finish_filerecv();
        sfree(stat_name);
        sfree(destfname);
    }
  out:
    strbuf_free(act.buf);
}